

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.pb.cc
# Opt level: O0

void __thiscall bloaty::Regex::Regex(Regex *this,Regex *from)

{
  bool bVar1;
  InternalMetadataWithArena *this_00;
  string *psVar2;
  string *default_value;
  Regex *in_RSI;
  undefined8 *in_RDI;
  Arena *in_stack_ffffffffffffff08;
  InternalMetadataWithArena *in_stack_ffffffffffffff10;
  string *in_stack_ffffffffffffff20;
  ArenaStringPtr *in_stack_ffffffffffffff28;
  ArenaStringPtr in_stack_ffffffffffffff30;
  
  google::protobuf::Message::Message((Message *)in_stack_ffffffffffffff10);
  *in_RDI = &PTR__Regex_00918880;
  google::protobuf::internal::InternalMetadataWithArena::InternalMetadataWithArena
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  *(uint32 *)(in_RDI + 2) = (in_RSI->_has_bits_).has_bits_[0];
  google::protobuf::internal::CachedSize::CachedSize((CachedSize *)0x1c9dbb);
  this_00 = &in_RSI->_internal_metadata_;
  if (((uint)(this_00->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    if (((uint)(this_00->
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ).ptr_ & 1) == 1) {
      google::protobuf::internal::
      InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
      ::
      PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                  *)this_00);
    }
    else {
      google::protobuf::internal::InternalMetadataWithArena::default_instance();
    }
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (in_stack_ffffffffffffff10,(UnknownFieldSet *)in_stack_ffffffffffffff08);
  }
  psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault
            ((ArenaStringPtr *)(in_RDI + 3),psVar2);
  bVar1 = _internal_has_pattern(in_RSI);
  if (bVar1) {
    in_stack_ffffffffffffff30.ptr_ = (string *)(in_RDI + 3);
    google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff30);
  }
  psVar2 = (string *)(in_RDI + 4);
  default_value = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault
            ((ArenaStringPtr *)psVar2,default_value);
  bVar1 = _internal_has_replacement(in_RSI);
  if (bVar1) {
    google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              ((ArenaStringPtr *)default_value,psVar2,in_stack_ffffffffffffff30);
  }
  return;
}

Assistant:

Regex::Regex(const Regex& from)
  : ::PROTOBUF_NAMESPACE_ID::Message(),
      _internal_metadata_(nullptr),
      _has_bits_(from._has_bits_) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  pattern_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_pattern()) {
    pattern_.AssignWithDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from.pattern_);
  }
  replacement_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_replacement()) {
    replacement_.AssignWithDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from.replacement_);
  }
  // @@protoc_insertion_point(copy_constructor:bloaty.Regex)
}